

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void ShowExampleMenuFile(void)

{
  bool bVar1;
  ImU32 col;
  char *label;
  ImDrawList *this;
  int idx;
  int i;
  uint uVar2;
  float fVar3;
  ImVec2 local_68;
  ImVec2 p;
  
  ImGui::MenuItem("(dummy menu)",(char *)0x0,false,false);
  ImGui::MenuItem("New",(char *)0x0,false,true);
  ImGui::MenuItem("Open","Ctrl+O",false,true);
  bVar1 = ImGui::BeginMenu("Open Recent",true);
  if (bVar1) {
    ImGui::MenuItem("fish_hat.c",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.inl",(char *)0x0,false,true);
    ImGui::MenuItem("fish_hat.h",(char *)0x0,false,true);
    bVar1 = ImGui::BeginMenu("More..",true);
    if (bVar1) {
      ImGui::MenuItem("Hello",(char *)0x0,false,true);
      ImGui::MenuItem("Sailor",(char *)0x0,false,true);
      bVar1 = ImGui::BeginMenu("Recurse..",true);
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  ImGui::MenuItem("Save","Ctrl+S",false,true);
  ImGui::MenuItem("Save As..",(char *)0x0,false,true);
  ImGui::Separator();
  bVar1 = ImGui::BeginMenu("Options",true);
  if (bVar1) {
    ImGui::MenuItem("Enabled","",&ShowExampleMenuFile::enabled,true);
    p.x = 0.0;
    p.y = 60.0;
    ImGui::BeginChild("child",&p,true,0);
    for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
      ImGui::Text("Scrolling Text %d",(ulong)uVar2);
    }
    ImGui::EndChild();
    ImGui::SliderFloat("Value",&ShowExampleMenuFile::f,0.0,1.0,"%.3f",1.0);
    ImGui::InputFloat("Input",&ShowExampleMenuFile::f,0.1,0.0,"%.3f",0);
    ImGui::Combo("Combo",&ShowExampleMenuFile::n,"Yes",-1);
    ImGui::Checkbox("Check",&ShowExampleMenuFile::b);
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Colors",true);
  if (bVar1) {
    fVar3 = ImGui::GetTextLineHeight();
    for (idx = 0; idx != 0x30; idx = idx + 1) {
      label = ImGui::GetStyleColorName(idx);
      p = ImGui::GetCursorScreenPos();
      this = ImGui::GetWindowDrawList();
      local_68.y = p.y + fVar3;
      local_68.x = p.x + fVar3;
      col = ImGui::GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled(this,&p,&local_68,col,0.0,0xf);
      local_68.y = fVar3;
      local_68.x = fVar3;
      ImGui::Dummy(&local_68);
      ImGui::SameLine(0.0,-1.0);
      ImGui::MenuItem(label,(char *)0x0,false,true);
    }
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu("Disabled",false);
  if (!bVar1) {
    ImGui::MenuItem("Checked",(char *)0x0,true,true);
    ImGui::MenuItem("Quit","Alt+F4",false,true);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_demo.cpp"
                ,0xd66,"void ShowExampleMenuFile()");
}

Assistant:

static void ShowExampleMenuFile()
{
    ImGui::MenuItem("(dummy menu)", NULL, false, false);
    if (ImGui::MenuItem("New")) {}
    if (ImGui::MenuItem("Open", "Ctrl+O")) {}
    if (ImGui::BeginMenu("Open Recent"))
    {
        ImGui::MenuItem("fish_hat.c");
        ImGui::MenuItem("fish_hat.inl");
        ImGui::MenuItem("fish_hat.h");
        if (ImGui::BeginMenu("More.."))
        {
            ImGui::MenuItem("Hello");
            ImGui::MenuItem("Sailor");
            if (ImGui::BeginMenu("Recurse.."))
            {
                ShowExampleMenuFile();
                ImGui::EndMenu();
            }
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Save", "Ctrl+S")) {}
    if (ImGui::MenuItem("Save As..")) {}
    ImGui::Separator();
    if (ImGui::BeginMenu("Options"))
    {
        static bool enabled = true;
        ImGui::MenuItem("Enabled", "", &enabled);
        ImGui::BeginChild("child", ImVec2(0, 60), true);
        for (int i = 0; i < 10; i++)
            ImGui::Text("Scrolling Text %d", i);
        ImGui::EndChild();
        static float f = 0.5f;
        static int n = 0;
        static bool b = true;
        ImGui::SliderFloat("Value", &f, 0.0f, 1.0f);
        ImGui::InputFloat("Input", &f, 0.1f);
        ImGui::Combo("Combo", &n, "Yes\0No\0Maybe\0\0");
        ImGui::Checkbox("Check", &b);
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Colors"))
    {
        float sz = ImGui::GetTextLineHeight();
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName((ImGuiCol)i);
            ImVec2 p = ImGui::GetCursorScreenPos();
            ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x+sz, p.y+sz), ImGui::GetColorU32((ImGuiCol)i));
            ImGui::Dummy(ImVec2(sz, sz));
            ImGui::SameLine();
            ImGui::MenuItem(name);
        }
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Disabled", false)) // Disabled
    {
        IM_ASSERT(0);
    }
    if (ImGui::MenuItem("Checked", NULL, true)) {}
    if (ImGui::MenuItem("Quit", "Alt+F4")) {}
}